

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall
groundupdbext::EmbeddedDatabase::Impl::indexForBucket(Impl *this,HashedValue *key,string *bucket)

{
  pointer pKVar1;
  pointer this_00;
  size_t length;
  size_t hash;
  unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>
  *this_01;
  pair<std::__detail::_Node_iterator<groundupdb::EncodedValue,_true,_true>,_bool> pVar2;
  HashedValue local_1a8;
  _Node_iterator_base<groundupdb::EncodedValue,_true> local_170;
  undefined1 local_168;
  size_t local_160;
  size_t local_158;
  Bytes local_150;
  Type local_134;
  Bytes local_130;
  EncodedValue local_118;
  _Node_iterator_base<groundupdb::EncodedValue,_true> local_d8;
  iterator found;
  unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
  local_98;
  Set keys;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  EncodedValue idxKey;
  string *bucket_local;
  HashedValue *key_local;
  Impl *this_local;
  
  idxKey.m_value.m_hash = (size_t)bucket;
  std::operator+(&local_80,"bucket::",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bucket);
  groundupdb::EncodedValue::EncodedValue((EncodedValue *)local_60,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  pKVar1 = std::
           unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>::
           operator->(&this->m_indexStore);
  groundupdb::HashedValue::HashedValue((HashedValue *)&found,(EncodedValue *)local_60);
  (*(pKVar1->super_Store)._vptr_Store[5])(&local_98,pKVar1,&found);
  groundupdb::HashedValue::~HashedValue((HashedValue *)&found);
  this_00 = std::
            unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
            ::operator->(&local_98);
  groundupdb::HashedValue::data(&local_130,key);
  length = groundupdb::HashedValue::length(key);
  hash = groundupdb::HashedValue::hash(key);
  groundupdb::EncodedValue::EncodedValue(&local_118,KEY,&local_130,length,hash);
  local_d8._M_cur =
       (__node_type *)
       std::
       unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
       ::find(this_00,&local_118);
  groundupdb::EncodedValue::~EncodedValue(&local_118);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector(&local_130);
  this_01 = (unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>
             *)std::
               unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
               ::operator->(&local_98);
  local_134 = KEY;
  groundupdb::HashedValue::data(&local_150,key);
  local_158 = groundupdb::HashedValue::length(key);
  local_160 = groundupdb::HashedValue::hash(key);
  pVar2 = std::
          unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>
          ::
          emplace<groundupdb::Type,std::vector<std::byte,std::allocator<std::byte>>const,unsigned_long,unsigned_long>
                    (this_01,&local_134,&local_150,&local_158,&local_160);
  local_170._M_cur =
       (__node_type *)pVar2.first.super__Node_iterator_base<groundupdb::EncodedValue,_true>._M_cur;
  local_168 = pVar2.second;
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector(&local_150);
  pKVar1 = std::
           unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>::
           operator->(&this->m_indexStore);
  groundupdb::HashedValue::HashedValue(&local_1a8,(EncodedValue *)local_60);
  (*(pKVar1->super_Store)._vptr_Store[4])(pKVar1,&local_1a8,&local_98);
  groundupdb::HashedValue::~HashedValue(&local_1a8);
  std::
  unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
  ::~unique_ptr(&local_98);
  groundupdb::EncodedValue::~EncodedValue((EncodedValue *)local_60);
  return;
}

Assistant:

void EmbeddedDatabase::Impl::indexForBucket(const HashedValue& key,const std::string& bucket) {
  // Add to bucket index
  EncodedValue idxKey("bucket::" + bucket);
  // query the key index
  //std::cout << "indexForBucket Fetching key set" << std::endl;
  Set keys = m_indexStore->getKeyValueSet(idxKey);
  //std::cout << "indexForBucket size currently: " << keys->size() << std::endl;
  //for (auto kiter = keys->begin();kiter != keys->end();kiter++) {
  //  std::cout << "  EncodedValue has value?: " << kiter->hasValue() << ", length: " << kiter->length() << ", hash: " << kiter->hash() << std::endl;
  //}
  //std::cout << "indexForBucket adding key" << std::endl;
  auto found = keys->find(EncodedValue(groundupdb::Type::KEY,key.data(),key.length(),key.hash()));
  //if (found != keys->end()) {
  //  std::cout << "WARNING: Specified value already exists in the set" << std::endl;
  //}
  keys->emplace(groundupdb::Type::KEY,key.data(),key.length(),key.hash());
  //std::cout << "indexForBucket size will now be: " << keys->size() << std::endl;
  //for (auto kiter = keys->begin();kiter != keys->end();kiter++) {
  //  std::cout << "  Now EncodedValue has value?: " << kiter->hasValue() << ", length: " << kiter->length() << ", hash: " << kiter->hash() << std::endl;
  //}
  //std::cout << "indexForBucket Setting kv" << std::endl;
  m_indexStore->setKeyValue(idxKey,std::move(keys)); // TODO do we need this? Yes - may not be in memory store
  // TODO replace the above with appendKeyValue(key,value)
}